

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

DataLocationUsage * __thiscall
kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::add<>
          (Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *this)

{
  bool bVar1;
  DataLocationUsage *pDVar2;
  Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *this_local;
  
  bVar1 = ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
          isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  pDVar2 = ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
           add<>(&this->builder);
  return pDVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }